

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

Thread * __thiscall re2::NFA::AllocThread(NFA *this)

{
  char **ppcVar1;
  size_t size;
  Thread *pTVar2;
  _Elt_pointer pTVar3;
  
  pTVar2 = this->freelist_;
  if (pTVar2 == (Thread *)0x0) {
    std::deque<re2::NFA::Thread,_std::allocator<re2::NFA::Thread>_>::emplace_back<>(&this->arena_);
    pTVar3 = (this->arena_).super__Deque_base<re2::NFA::Thread,_std::allocator<re2::NFA::Thread>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pTVar3 == (this->arena_).
                  super__Deque_base<re2::NFA::Thread,_std::allocator<re2::NFA::Thread>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pTVar3 = (this->arena_).super__Deque_base<re2::NFA::Thread,_std::allocator<re2::NFA::Thread>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    pTVar2 = pTVar3 + -1;
    pTVar3[-1].field_0.ref = 1;
    size = 0xffffffffffffffff;
    if (-1 < (long)this->ncapture_) {
      size = (long)this->ncapture_ * 8;
    }
    ppcVar1 = (char **)operator_new__(size);
    pTVar3[-1].capture = ppcVar1;
  }
  else {
    this->freelist_ = (Thread *)pTVar2->field_0;
    (pTVar2->field_0).ref = 1;
  }
  return pTVar2;
}

Assistant:

NFA::Thread* NFA::AllocThread() {
  Thread* t = freelist_;
  if (t != NULL) {
    freelist_ = t->next;
    t->ref = 1;
    // We don't need to touch t->capture because
    // the caller will immediately overwrite it.
    return t;
  }
  arena_.emplace_back();
  t = &arena_.back();
  t->ref = 1;
  t->capture = new const char*[ncapture_];
  return t;
}